

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

bool GlobOpt::NeedsTypeCheckBailOut
               (Instr *instr,PropertySymOpnd *propertySymOpnd,bool isStore,
               bool *pIsTypeCheckProtected,BailOutKind *pBailOutKind)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  BailOutKind local_48;
  bool isCheckFixedFld;
  BailOutKind *pBailOutKind_local;
  bool *pIsTypeCheckProtected_local;
  bool isStore_local;
  PropertySymOpnd *propertySymOpnd_local;
  Instr *instr_local;
  
  if ((instr->m_opcode == CheckPropertyGuardAndLoadType) ||
     (instr->m_opcode == LdMethodFldPolyInlineMiss)) {
    instr_local._7_1_ = false;
  }
  else {
    if ((instr->m_opcode == CheckFixedFld) &&
       ((bVar2 = IR::PropertySymOpnd::UsesFixedValue(propertySymOpnd), !bVar2 ||
        (bVar2 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(propertySymOpnd), !bVar2)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x5a4,
                         "(instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection()))"
                         ,
                         "instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection())"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(propertySymOpnd);
    if (bVar2) {
      bVar2 = instr->m_opcode == CheckFixedFld;
      if (bVar2) {
        uVar4 = Func::GetSourceContextId(instr->m_func);
        uVar5 = Func::GetLocalFunctionId(instr->m_func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedMethodsPhase,uVar4,uVar5);
        if (bVar3) {
          uVar4 = Func::GetSourceContextId(instr->m_func);
          uVar5 = Func::GetLocalFunctionId(instr->m_func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,UseFixedDataPropsPhase,uVar4,uVar5);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x5aa,
                               "(!isCheckFixedFld || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                               ,"CheckFixedFld with fixed method/data phase disabled?");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      if ((isStore) && (bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x5ab,"(!isStore || !isCheckFixedFld)","!isStore || !isCheckFixedFld");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if ((isStore) && (bVar3 = IR::PropertySymOpnd::IsLoadedFromProto(propertySymOpnd), bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x5ad,"(!isStore || !propertySymOpnd->IsLoadedFromProto())",
                           "!isStore || !propertySymOpnd->IsLoadedFromProto()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar3 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(propertySymOpnd);
      if (bVar3) {
        bVar3 = IR::PropertySymOpnd::HasEquivalentTypeSet(propertySymOpnd);
        if ((!bVar3) || (bVar3 = IR::PropertySymOpnd::MustDoMonoCheck(propertySymOpnd), bVar3)) {
          local_48 = BailOutFailedTypeCheck;
          if (bVar2) {
            local_48 = BailOutFailedFixedFieldTypeCheck;
          }
        }
        else {
          local_48 = BailOutFailedEquivalentTypeCheck;
          if (bVar2) {
            local_48 = BailOutFailedEquivalentFixedFieldTypeCheck;
          }
        }
        *pBailOutKind = local_48;
        instr_local._7_1_ = true;
      }
      else {
        bVar2 = IR::PropertySymOpnd::IsTypeCheckProtected(propertySymOpnd);
        *pIsTypeCheckProtected = bVar2;
        *pBailOutKind = BailOutInvalid;
        instr_local._7_1_ = false;
      }
    }
    else {
      if (instr->m_opcode == CheckFixedFld) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x5bf,"(instr->m_opcode != Js::OpCode::CheckFixedFld)",
                           "instr->m_opcode != Js::OpCode::CheckFixedFld");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      *pBailOutKind = BailOutInvalid;
      instr_local._7_1_ = false;
    }
  }
  return instr_local._7_1_;
}

Assistant:

bool
GlobOpt::NeedsTypeCheckBailOut(const IR::Instr *instr, IR::PropertySymOpnd *propertySymOpnd, bool isStore, bool* pIsTypeCheckProtected, IR::BailOutKind *pBailOutKind)
{
    if (instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss)
    {
        return false;
    }
    // CheckFixedFld always requires a type check and bailout either at the instruction or upstream.
    Assert(instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection()));

    if (propertySymOpnd->MayNeedTypeCheckProtection())
    {
        bool isCheckFixedFld = instr->m_opcode == Js::OpCode::CheckFixedFld;
        AssertMsg(!isCheckFixedFld || !PHASE_OFF(Js::FixedMethodsPhase, instr->m_func) ||
            !PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func), "CheckFixedFld with fixed method/data phase disabled?");
        Assert(!isStore || !isCheckFixedFld);
        // We don't share caches between field loads and stores.  We should never have a field store involving a proto cache.
        Assert(!isStore || !propertySymOpnd->IsLoadedFromProto());

        if (propertySymOpnd->NeedsTypeCheckAndBailOut())
        {
            *pBailOutKind = propertySymOpnd->HasEquivalentTypeSet() && !propertySymOpnd->MustDoMonoCheck() ?
                (isCheckFixedFld ? IR::BailOutFailedEquivalentFixedFieldTypeCheck : IR::BailOutFailedEquivalentTypeCheck) :
                (isCheckFixedFld ? IR::BailOutFailedFixedFieldTypeCheck : IR::BailOutFailedTypeCheck);
            return true;
        }
        else
        {
            *pIsTypeCheckProtected = propertySymOpnd->IsTypeCheckProtected();
            *pBailOutKind = IR::BailOutInvalid;
            return false;
        }
    }
    else
    {
        Assert(instr->m_opcode != Js::OpCode::CheckFixedFld);
        *pBailOutKind = IR::BailOutInvalid;
        return false;
    }
}